

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::Printer::GetSubstitutionRange
          (Printer *this,char *varname,pair<unsigned_long,_unsigned_long> *range)

{
  iterator iVar1;
  LogMessage *pLVar2;
  allocator local_59;
  undefined1 local_58 [56];
  
  std::__cxx11::string::string((string *)local_58,varname,&local_59);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
          ::find(&(this->substitutions_)._M_t,(key_type *)local_58);
  if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((_Rb_tree_header *)iVar1._M_node == &(this->substitutions_)._M_t._M_impl.super__Rb_tree_header
     ) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/printer.cc"
               ,0x4d);
    pLVar2 = internal::LogMessage::operator<<
                       ((LogMessage *)local_58," Undefined variable in annotation: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,varname);
    internal::LogFinisher::operator=((LogFinisher *)&local_59,pLVar2);
  }
  else {
    if (*(_Base_ptr *)(iVar1._M_node + 2) <= iVar1._M_node[2]._M_parent) {
      range->first = (unsigned_long)*(_Base_ptr *)(iVar1._M_node + 2);
      range->second = (unsigned_long)iVar1._M_node[2]._M_parent;
      return true;
    }
    internal::LogMessage::LogMessage
              ((LogMessage *)local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/printer.cc"
               ,0x51);
    pLVar2 = internal::LogMessage::operator<<
                       ((LogMessage *)local_58," Variable used for annotation used multiple times: "
                       );
    pLVar2 = internal::LogMessage::operator<<(pLVar2,varname);
    internal::LogFinisher::operator=((LogFinisher *)&local_59,pLVar2);
  }
  internal::LogMessage::~LogMessage((LogMessage *)local_58);
  return false;
}

Assistant:

bool Printer::GetSubstitutionRange(const char* varname,
                                   std::pair<size_t, size_t>* range) {
  std::map<string, std::pair<size_t, size_t> >::const_iterator iter =
      substitutions_.find(varname);
  if (iter == substitutions_.end()) {
    GOOGLE_LOG(DFATAL) << " Undefined variable in annotation: " << varname;
    return false;
  }
  if (iter->second.first > iter->second.second) {
    GOOGLE_LOG(DFATAL) << " Variable used for annotation used multiple times: "
                << varname;
    return false;
  }
  *range = iter->second;
  return true;
}